

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

void __thiscall QResourceFileEnginePrivate::mapUncompressed(QResourceFileEnginePrivate *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  bool bVar4;
  qint64 qVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = QByteArray::isNull(&this->uncompressed);
  if (bVar4) {
    qVar5 = QResource::uncompressedSize(&this->resource);
    if (0x3fff < qVar5) {
      bVar4 = mapUncompressed_sys(this);
      if (bVar4) goto LAB_00238cb4;
    }
    QResource::uncompressedData((QByteArray *)&local_48,&this->resource);
    pDVar2 = (this->uncompressed).d.d;
    pcVar3 = (this->uncompressed).d.ptr;
    (this->uncompressed).d.d = local_48.d;
    (this->uncompressed).d.ptr = local_48.ptr;
    qVar1 = (this->uncompressed).d.size;
    (this->uncompressed).d.size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar3;
    local_48.size = qVar1;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
    QByteArray::detach(&this->uncompressed);
  }
LAB_00238cb4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QResourceFileEnginePrivate::mapUncompressed()
{
    Q_ASSERT(resource.compressionAlgorithm() == QResource::NoCompression);
    if (!uncompressed.isNull())
        return;     // nothing to do

    if (resource.uncompressedSize() >= RemapCompressedThreshold) {
        if (mapUncompressed_sys())
            return;
    }

    uncompressed = resource.uncompressedData();
    uncompressed.detach();
}